

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

void evmap_signal_active_(event_base *base,int sig,int ncalls)

{
  event *ev;
  anon_union_32_2_36317463_for_ev_ *paVar1;
  
  if (((-1 < sig) && (sig < (base->sigmap).nentries)) &&
     (paVar1 = (anon_union_32_2_36317463_for_ev_ *)(base->sigmap).entries[(uint)sig],
     paVar1 != (anon_union_32_2_36317463_for_ev_ *)0x0)) {
    while (ev = (paVar1->ev_io).ev_io_next.le_next, ev != (event *)0x0) {
      event_active_nolock_(ev,8,(short)ncalls);
      paVar1 = &ev->ev_;
    }
  }
  return;
}

Assistant:

void
evmap_signal_active_(struct event_base *base, evutil_socket_t sig, int ncalls)
{
	struct event_signal_map *map = &base->sigmap;
	struct evmap_signal *ctx;
	struct event *ev;

	if (sig < 0 || sig >= map->nentries)
		return;
	GET_SIGNAL_SLOT(ctx, map, sig, evmap_signal);

	if (!ctx)
		return;
	LIST_FOREACH(ev, &ctx->events, ev_signal_next)
		event_active_nolock_(ev, EV_SIGNAL, ncalls);
}